

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
scaling_Alloc(CUPDLPscaling *scaling,CUPDLPproblem *problem,cupdlp_int ncols,cupdlp_int nrows)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  undefined4 *in_RDI;
  double dVar2;
  cupdlp_retcode retcode;
  cupdlp_int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  cupdlp_retcode cVar3;
  
  cVar3 = 0;
  *in_RDI = 0;
  pvVar1 = malloc((long)in_EDX << 3);
  *(void **)(in_RDI + 4) = pvVar1;
  if (*(long *)(in_RDI + 4) == 0) {
    cVar3 = 1;
  }
  else {
    pvVar1 = malloc((long)in_ECX << 3);
    *(void **)(in_RDI + 2) = pvVar1;
    if (*(long *)(in_RDI + 2) == 0) {
      cVar3 = 1;
    }
    else {
      in_RDI[6] = 1;
      in_RDI[7] = 0;
      in_RDI[8] = 1;
      dVar2 = twoNorm((double *)CONCAT44(cVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
      ;
      *(double *)(in_RDI + 0xe) = dVar2;
      dVar2 = twoNorm((double *)CONCAT44(cVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
      ;
      *(double *)(in_RDI + 0x10) = dVar2;
    }
  }
  return cVar3;
}

Assistant:

cupdlp_retcode scaling_Alloc(CUPDLPscaling *scaling, CUPDLPproblem *problem,
                             cupdlp_int ncols, cupdlp_int nrows) {
  cupdlp_retcode retcode = RETCODE_OK;
  scaling->ifScaled = 0;

  CUPDLP_INIT_DOUBLE(scaling->colScale, ncols);
  CUPDLP_INIT_DOUBLE(scaling->rowScale, nrows);

  scaling->ifRuizScaling = 1;
  scaling->ifL2Scaling = 0;
  scaling->ifPcScaling = 1;

  scaling->dNormCost = twoNorm(problem->cost, problem->nCols);
  scaling->dNormRhs = twoNorm(problem->rhs, problem->nRows);

exit_cleanup:
  return retcode;
}